

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cc
# Opt level: O0

ReadResult __thiscall FileLineReader::ReadLine(FileLineReader *this,char *out,size_t len)

{
  int iVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  size_t sVar4;
  unsigned_long local_30;
  size_t local_28;
  size_t len_local;
  char *out_local;
  FileLineReader *this_local;
  
  local_28 = len;
  len_local = (size_t)out;
  out_local = (char *)this;
  if (len != 0) {
    if (this->file_ == (FILE *)0x0) {
      this_local._4_4_ = kReadError;
    }
    else {
      local_30 = 0x7fffffff;
      puVar2 = std::min<unsigned_long>(&local_28,&local_30);
      local_28 = *puVar2;
      pcVar3 = fgets((char *)len_local,(int)local_28,(FILE *)this->file_);
      if (pcVar3 == (char *)0x0) {
        iVar1 = feof((FILE *)this->file_);
        this_local._4_4_ = kReadError;
        if (iVar1 != 0) {
          this_local._4_4_ = kReadEOF;
        }
      }
      else {
        sVar4 = strlen((char *)len_local);
        if (((sVar4 == local_28 - 1) && (*(char *)(len_local + (local_28 - 2)) != '\n')) &&
           (iVar1 = feof((FILE *)this->file_), iVar1 == 0)) {
          fprintf(_stderr,"Line too long.\n");
          this_local._4_4_ = kReadError;
        }
        else {
          this_local._4_4_ = kReadSuccess;
        }
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/test/file_test.cc"
                ,0x179,"virtual FileTest::ReadResult FileLineReader::ReadLine(char *, size_t)");
}

Assistant:

FileTest::ReadResult ReadLine(char *out, size_t len) override {
    assert(len > 0);
    if (file_ == nullptr) {
      return FileTest::kReadError;
    }

    len = std::min(len, size_t{INT_MAX});
    if (fgets(out, static_cast<int>(len), file_) == nullptr) {
      return feof(file_) ? FileTest::kReadEOF : FileTest::kReadError;
    }

    if (strlen(out) == len - 1 && out[len - 2] != '\n' && !feof(file_)) {
      fprintf(stderr, "Line too long.\n");
      return FileTest::kReadError;
    }

    return FileTest::kReadSuccess;
  }